

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
               (triplet<unsigned_char> *destination,triplet<unsigned_char> *source,
               size_t pixel_count,inverse *transform)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  
  if (pixel_count != 0) {
    lVar3 = 0;
    do {
      bVar1 = (&source->field_2)[lVar3].v3;
      uVar4 = ((uint)(&source->field_0)[lVar3].v1 -
              ((uint)bVar1 + (uint)(&source->field_1)[lVar3].v2 >> 2)) + 0x40;
      cVar2 = (char)uVar4;
      (&destination->field_2)[lVar3].v3 = (&source->field_1)[lVar3].v2 + cVar2 + 0x80;
      *(ushort *)(&destination->field_0 + lVar3) =
           (ushort)(byte)(bVar1 + cVar2 + 0x80) | (ushort)((uVar4 & 0xff) << 8);
      lVar3 = lVar3 + 3;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1, source[i].v2, source[i].v3);
    }
}